

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::TestSpecParser::addPattern<Catch::TestSpec::TagPattern>(TestSpecParser *this)

{
  NonCopyable NVar1;
  int iVar2;
  long *plVar3;
  pointer puVar4;
  Pattern *pPVar5;
  Pattern *p;
  pointer puVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  Ptr<Catch::TestSpec::Pattern> pattern;
  string token;
  NonCopyable local_b0;
  ulong local_a8;
  Pattern local_a0;
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  string local_70;
  ulong *local_50;
  long local_48;
  ulong local_40 [2];
  
  std::__cxx11::string::substr((ulong)&local_70,(ulong)&this->m_arg);
  puVar4 = (this->m_escapeChars).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar6 = (this->m_escapeChars).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (puVar6 != puVar4) {
    uVar8 = 0;
    do {
      std::__cxx11::string::substr((ulong)&local_50,(ulong)&local_70);
      std::__cxx11::string::substr((ulong)&local_90,(ulong)&local_70);
      uVar7 = 0xf;
      if (local_50 != local_40) {
        uVar7 = local_40[0];
      }
      if (uVar7 < (ulong)(local_88 + local_48)) {
        uVar7 = 0xf;
        if (local_90 != local_80) {
          uVar7 = local_80[0];
        }
        if (uVar7 < (ulong)(local_88 + local_48)) goto LAB_001264d3;
        plVar3 = (long *)std::__cxx11::string::replace
                                   ((ulong)&local_90,0,(char *)0x0,(ulong)local_50);
      }
      else {
LAB_001264d3:
        plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_90);
      }
      pPVar5 = (Pattern *)(plVar3 + 2);
      if ((Pattern *)*plVar3 == pPVar5) {
        local_a0.super_SharedImpl<Catch::IShared>.super_IShared.super_NonCopyable._vptr_NonCopyable
             = (NonCopyable)
               (pPVar5->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable.
               _vptr_NonCopyable;
        local_a0.super_SharedImpl<Catch::IShared>._8_8_ = plVar3[3];
        local_b0._vptr_NonCopyable = (_func_int **)&local_a0;
      }
      else {
        local_a0.super_SharedImpl<Catch::IShared>.super_IShared.super_NonCopyable._vptr_NonCopyable
             = (NonCopyable)
               (pPVar5->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable.
               _vptr_NonCopyable;
        local_b0._vptr_NonCopyable = (_func_int **)*plVar3;
      }
      local_a8 = plVar3[1];
      *plVar3 = (long)pPVar5;
      plVar3[1] = 0;
      *(undefined1 *)
       &(pPVar5->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable._vptr_NonCopyable
           = 0;
      std::__cxx11::string::operator=((string *)&local_70,(string *)&local_b0);
      if ((Pattern *)local_b0._vptr_NonCopyable != &local_a0) {
        operator_delete(local_b0._vptr_NonCopyable);
      }
      if (local_90 != local_80) {
        operator_delete(local_90);
      }
      if (local_50 != local_40) {
        operator_delete(local_50);
      }
      uVar8 = uVar8 + 1;
      puVar4 = (this->m_escapeChars).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar6 = (this->m_escapeChars).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
    } while (uVar8 < (ulong)((long)puVar6 - (long)puVar4 >> 3));
  }
  if (puVar6 != puVar4) {
    (this->m_escapeChars).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar4;
  }
  local_b0._vptr_NonCopyable = (_func_int **)&local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"exclude:","");
  NVar1._vptr_NonCopyable = local_b0._vptr_NonCopyable;
  if (local_70._M_string_length < local_a8) {
    bVar9 = false;
  }
  else if (local_a8 == 0) {
    bVar9 = true;
  }
  else {
    iVar2 = bcmp(local_b0._vptr_NonCopyable,local_70._M_dataplus._M_p,local_a8);
    bVar9 = iVar2 == 0;
  }
  if ((Pattern *)NVar1._vptr_NonCopyable != &local_a0) {
    operator_delete(NVar1._vptr_NonCopyable);
  }
  if (bVar9) {
    this->m_exclusion = true;
    std::__cxx11::string::substr((ulong)&local_b0,(ulong)&local_70);
    std::__cxx11::string::operator=((string *)&local_70,(string *)&local_b0);
    if ((Pattern *)local_b0._vptr_NonCopyable != &local_a0) {
      operator_delete(local_b0._vptr_NonCopyable);
    }
  }
  if (local_70._M_string_length != 0) {
    pPVar5 = (Pattern *)operator_new(0x30);
    (pPVar5->super_SharedImpl<Catch::IShared>).m_rc = 0;
    (pPVar5->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable =
         (NonCopyable)&PTR__TagPattern_00161ad0;
    toLower((string *)(pPVar5 + 1),&local_70);
    local_b0._vptr_NonCopyable = (_func_int **)pPVar5;
    (**(code **)((long)(pPVar5->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable +
                0x10))(pPVar5);
    if (this->m_exclusion == true) {
      p = (Pattern *)operator_new(0x18);
      (p->super_SharedImpl<Catch::IShared>).m_rc = 0;
      (p->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable._vptr_NonCopyable =
           (_func_int **)&PTR__ExcludedPattern_00161b08;
      p[1].super_SharedImpl<Catch::IShared>.super_IShared.super_NonCopyable._vptr_NonCopyable =
           (_func_int **)pPVar5;
      (**(code **)((long)(pPVar5->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable
                  + 0x10))(pPVar5);
      Ptr<Catch::TestSpec::Pattern>::operator=((Ptr<Catch::TestSpec::Pattern> *)&local_b0,p);
    }
    std::
    vector<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
    ::push_back(&(this->m_currentFilter).m_patterns,(value_type *)&local_b0);
    if ((Pattern *)local_b0._vptr_NonCopyable != (Pattern *)0x0) {
      (**(code **)(*local_b0._vptr_NonCopyable + 0x18))();
    }
  }
  this->m_exclusion = false;
  this->m_mode = None;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  return;
}

Assistant:

void addPattern() {
            std::string token = subString();
            for( size_t i = 0; i < m_escapeChars.size(); ++i )
                token = token.substr( 0, m_escapeChars[i]-m_start-i ) + token.substr( m_escapeChars[i]-m_start-i+1 );
            m_escapeChars.clear();
            if( startsWith( token, "exclude:" ) ) {
                m_exclusion = true;
                token = token.substr( 8 );
            }
            if( !token.empty() ) {
                Ptr<TestSpec::Pattern> pattern = new T( token );
                if( m_exclusion )
                    pattern = new TestSpec::ExcludedPattern( pattern );
                m_currentFilter.m_patterns.push_back( pattern );
            }
            m_exclusion = false;
            m_mode = None;
        }